

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void GetNotHEV_SSE2(__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,int hev_thresh,__m128i *not_hev)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 local_18c;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong uStack_130;
  ulong local_128;
  ulong uStack_120;
  __m128i t_max_h;
  __m128i t_max;
  __m128i h;
  __m128i t_2;
  __m128i t_1;
  __m128i zero;
  __m128i *not_hev_local;
  int hev_thresh_local;
  __m128i *q1_local;
  __m128i *q0_local;
  
  auVar2 = psubusb((undefined1  [16])*p0,(undefined1  [16])*p1);
  auVar1 = psubusb((undefined1  [16])*p1,(undefined1  [16])*p0);
  local_128 = auVar2._0_8_;
  uStack_120 = auVar2._8_8_;
  local_138 = auVar1._0_8_;
  uStack_130 = auVar1._8_8_;
  local_128 = local_128 | local_138;
  uStack_120 = uStack_120 | uStack_130;
  auVar2 = psubusb((undefined1  [16])*q0,(undefined1  [16])*q1);
  auVar1 = psubusb((undefined1  [16])*q1,(undefined1  [16])*q0);
  local_148 = auVar2._0_8_;
  uStack_140 = auVar2._8_8_;
  local_158 = auVar1._0_8_;
  uStack_150 = auVar1._8_8_;
  local_148 = local_148 | local_158;
  uStack_140 = uStack_140 | uStack_150;
  local_18c = (undefined1)hev_thresh;
  auVar1[1] = local_18c;
  auVar1[0] = local_18c;
  auVar1[2] = local_18c;
  auVar1[3] = local_18c;
  auVar1[4] = local_18c;
  auVar1[5] = local_18c;
  auVar1[6] = local_18c;
  auVar1[7] = local_18c;
  auVar1[9] = local_18c;
  auVar1[8] = local_18c;
  auVar1[10] = local_18c;
  auVar1[0xb] = local_18c;
  auVar1[0xc] = local_18c;
  auVar1[0xd] = local_18c;
  auVar1[0xe] = local_18c;
  auVar1[0xf] = local_18c;
  t_max[1]._0_1_ = (byte)local_128;
  t_max[1]._1_1_ = (byte)(local_128 >> 8);
  t_max[1]._2_1_ = (byte)(local_128 >> 0x10);
  t_max[1]._3_1_ = (byte)(local_128 >> 0x18);
  t_max[1]._4_1_ = (byte)(local_128 >> 0x20);
  t_max[1]._5_1_ = (byte)(local_128 >> 0x28);
  t_max[1]._6_1_ = (byte)(local_128 >> 0x30);
  t_max[1]._7_1_ = (byte)(local_128 >> 0x38);
  h[0]._0_1_ = (byte)uStack_120;
  h[0]._1_1_ = (byte)(uStack_120 >> 8);
  h[0]._2_1_ = (byte)(uStack_120 >> 0x10);
  h[0]._3_1_ = (byte)(uStack_120 >> 0x18);
  h[0]._4_1_ = (byte)(uStack_120 >> 0x20);
  h[0]._5_1_ = (byte)(uStack_120 >> 0x28);
  h[0]._6_1_ = (byte)(uStack_120 >> 0x30);
  h[0]._7_1_ = (byte)(uStack_120 >> 0x38);
  t_max_h[1]._0_1_ = (byte)local_148;
  t_max_h[1]._1_1_ = (byte)(local_148 >> 8);
  t_max_h[1]._2_1_ = (byte)(local_148 >> 0x10);
  t_max_h[1]._3_1_ = (byte)(local_148 >> 0x18);
  t_max_h[1]._4_1_ = (byte)(local_148 >> 0x20);
  t_max_h[1]._5_1_ = (byte)(local_148 >> 0x28);
  t_max_h[1]._6_1_ = (byte)(local_148 >> 0x30);
  t_max_h[1]._7_1_ = (byte)(local_148 >> 0x38);
  t_max[0]._0_1_ = (byte)uStack_140;
  t_max[0]._1_1_ = (byte)(uStack_140 >> 8);
  t_max[0]._2_1_ = (byte)(uStack_140 >> 0x10);
  t_max[0]._3_1_ = (byte)(uStack_140 >> 0x18);
  t_max[0]._4_1_ = (byte)(uStack_140 >> 0x20);
  t_max[0]._5_1_ = (byte)(uStack_140 >> 0x28);
  t_max[0]._6_1_ = (byte)(uStack_140 >> 0x30);
  t_max[0]._7_1_ = (byte)(uStack_140 >> 0x38);
  auVar2[1] = (t_max[1]._1_1_ < t_max_h[1]._1_1_) * t_max_h[1]._1_1_ |
              (t_max[1]._1_1_ >= t_max_h[1]._1_1_) * t_max[1]._1_1_;
  auVar2[0] = ((byte)t_max[1] < (byte)t_max_h[1]) * (byte)t_max_h[1] |
              ((byte)t_max[1] >= (byte)t_max_h[1]) * (byte)t_max[1];
  auVar2[2] = (t_max[1]._2_1_ < t_max_h[1]._2_1_) * t_max_h[1]._2_1_ |
              (t_max[1]._2_1_ >= t_max_h[1]._2_1_) * t_max[1]._2_1_;
  auVar2[3] = (t_max[1]._3_1_ < t_max_h[1]._3_1_) * t_max_h[1]._3_1_ |
              (t_max[1]._3_1_ >= t_max_h[1]._3_1_) * t_max[1]._3_1_;
  auVar2[4] = (t_max[1]._4_1_ < t_max_h[1]._4_1_) * t_max_h[1]._4_1_ |
              (t_max[1]._4_1_ >= t_max_h[1]._4_1_) * t_max[1]._4_1_;
  auVar2[5] = (t_max[1]._5_1_ < t_max_h[1]._5_1_) * t_max_h[1]._5_1_ |
              (t_max[1]._5_1_ >= t_max_h[1]._5_1_) * t_max[1]._5_1_;
  auVar2[6] = (t_max[1]._6_1_ < t_max_h[1]._6_1_) * t_max_h[1]._6_1_ |
              (t_max[1]._6_1_ >= t_max_h[1]._6_1_) * t_max[1]._6_1_;
  auVar2[7] = (t_max[1]._7_1_ < t_max_h[1]._7_1_) * t_max_h[1]._7_1_ |
              (t_max[1]._7_1_ >= t_max_h[1]._7_1_) * t_max[1]._7_1_;
  auVar2[9] = (h[0]._1_1_ < t_max[0]._1_1_) * t_max[0]._1_1_ |
              (h[0]._1_1_ >= t_max[0]._1_1_) * h[0]._1_1_;
  auVar2[8] = ((byte)h[0] < (byte)t_max[0]) * (byte)t_max[0] |
              ((byte)h[0] >= (byte)t_max[0]) * (byte)h[0];
  auVar2[10] = (h[0]._2_1_ < t_max[0]._2_1_) * t_max[0]._2_1_ |
               (h[0]._2_1_ >= t_max[0]._2_1_) * h[0]._2_1_;
  auVar2[0xb] = (h[0]._3_1_ < t_max[0]._3_1_) * t_max[0]._3_1_ |
                (h[0]._3_1_ >= t_max[0]._3_1_) * h[0]._3_1_;
  auVar2[0xc] = (h[0]._4_1_ < t_max[0]._4_1_) * t_max[0]._4_1_ |
                (h[0]._4_1_ >= t_max[0]._4_1_) * h[0]._4_1_;
  auVar2[0xd] = (h[0]._5_1_ < t_max[0]._5_1_) * t_max[0]._5_1_ |
                (h[0]._5_1_ >= t_max[0]._5_1_) * h[0]._5_1_;
  auVar2[0xe] = (h[0]._6_1_ < t_max[0]._6_1_) * t_max[0]._6_1_ |
                (h[0]._6_1_ >= t_max[0]._6_1_) * h[0]._6_1_;
  auVar2[0xf] = (h[0]._7_1_ < t_max[0]._7_1_) * t_max[0]._7_1_ |
                (h[0]._7_1_ >= t_max[0]._7_1_) * h[0]._7_1_;
  auVar1 = psubusb(auVar2,auVar1);
  t_1[1]._0_1_ = auVar1[0];
  t_1[1]._1_1_ = auVar1[1];
  t_1[1]._2_1_ = auVar1[2];
  t_1[1]._3_1_ = auVar1[3];
  t_1[1]._4_1_ = auVar1[4];
  t_1[1]._5_1_ = auVar1[5];
  t_1[1]._6_1_ = auVar1[6];
  t_1[1]._7_1_ = auVar1[7];
  zero[0]._0_1_ = auVar1[8];
  zero[0]._1_1_ = auVar1[9];
  zero[0]._2_1_ = auVar1[10];
  zero[0]._3_1_ = auVar1[0xb];
  zero[0]._4_1_ = auVar1[0xc];
  zero[0]._5_1_ = auVar1[0xd];
  zero[0]._6_1_ = auVar1[0xe];
  zero[0]._7_1_ = auVar1[0xf];
  *(char *)*not_hev = -((char)t_1[1] == '\0');
  *(char *)((long)*not_hev + 1) = -(t_1[1]._1_1_ == '\0');
  *(char *)((long)*not_hev + 2) = -(t_1[1]._2_1_ == '\0');
  *(char *)((long)*not_hev + 3) = -(t_1[1]._3_1_ == '\0');
  *(char *)((long)*not_hev + 4) = -(t_1[1]._4_1_ == '\0');
  *(char *)((long)*not_hev + 5) = -(t_1[1]._5_1_ == '\0');
  *(char *)((long)*not_hev + 6) = -(t_1[1]._6_1_ == '\0');
  *(char *)((long)*not_hev + 7) = -(t_1[1]._7_1_ == '\0');
  *(char *)(*not_hev + 1) = -((char)zero[0] == '\0');
  *(char *)((long)*not_hev + 9) = -(zero[0]._1_1_ == '\0');
  *(char *)((long)*not_hev + 10) = -(zero[0]._2_1_ == '\0');
  *(char *)((long)*not_hev + 0xb) = -(zero[0]._3_1_ == '\0');
  *(char *)((long)*not_hev + 0xc) = -(zero[0]._4_1_ == '\0');
  *(char *)((long)*not_hev + 0xd) = -(zero[0]._5_1_ == '\0');
  *(char *)((long)*not_hev + 0xe) = -(zero[0]._6_1_ == '\0');
  *(char *)((long)*not_hev + 0xf) = -(zero[0]._7_1_ == '\0');
  return;
}

Assistant:

static WEBP_INLINE void GetNotHEV_SSE2(const __m128i* const p1,
                                       const __m128i* const p0,
                                       const __m128i* const q0,
                                       const __m128i* const q1,
                                       int hev_thresh, __m128i* const not_hev) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i t_1 = MM_ABS(*p1, *p0);
  const __m128i t_2 = MM_ABS(*q1, *q0);

  const __m128i h = _mm_set1_epi8(hev_thresh);
  const __m128i t_max = _mm_max_epu8(t_1, t_2);

  const __m128i t_max_h = _mm_subs_epu8(t_max, h);
  *not_hev = _mm_cmpeq_epi8(t_max_h, zero);  // not_hev <= t1 && not_hev <= t2
}